

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

Section * elf_dyntable(GlobalVars *gv,unsigned_long initial_size,unsigned_long initial_offset,
                      uint8_t sectype,uint8_t secflags,uint8_t secprot,int type)

{
  bool bVar1;
  uint idx;
  Section *pSVar2;
  Symbol *pSVar3;
  ObjectUnit *ou;
  Section **ppSVar4;
  
  bVar1 = true;
  if (type == 1) {
    idx = 4;
    ppSVar4 = &gotsec;
  }
  else if (type == 2) {
    idx = 5;
    ppSVar4 = &pltsec;
  }
  else {
    ierror("%s wrong type: %d","elf_dyntable():",(ulong)(uint)type);
    bVar1 = false;
    idx = 0xffffffff;
    ppSVar4 = (Section **)initial_size;
  }
  pSVar2 = *ppSVar4;
  if (pSVar2 == (Section *)0x0) {
    ou = gv->dynobj;
    if (ou == (ObjectUnit *)0x0) {
      ierror("%s no dynobj","elf_dyntable():");
      ou = gv->dynobj;
    }
    pSVar2 = add_section(ou,elf_dyntable::secname[type],(uint8_t *)0x0,initial_size,sectype,secflags
                         ,secprot,'\x02',1);
    pSVar2->offset = initial_offset;
    *ppSVar4 = pSVar2;
    if (bVar1) {
      pSVar3 = findlnksymbol(gv,elf_symnames[idx]);
      if (pSVar3 == (Symbol *)0x0) {
        elf_makelnksym(gv,idx);
      }
    }
  }
  return pSVar2;
}

Assistant:

struct Section *elf_dyntable(struct GlobalVars *gv,
                             unsigned long initial_size,
                             unsigned long initial_offset,
                             uint8_t sectype,uint8_t secflags,
                             uint8_t secprot,int type)
/* return got/plt section, create new when missing */
{
  static const char fn[] = "elf_dyntable():";
  static const char *secname[] = { NULL, got_name, plt_name };
  struct Section *sec,**secp;
  struct ObjectUnit *ou;
  int symidx = -1;

  switch (type) {
    case GOT_ENTRY:
      secp = &gotsec;
      symidx = GLOBOFFSTAB;
      break;
    case PLT_ENTRY:
      secp = &pltsec;
      symidx = PROCLINKTAB;
      break;
    default:
      ierror("%s wrong type: %d",fn,type);
      break;
  }
  if (sec = *secp)
    return sec;

  if (gv->dynobj == NULL)
    ierror("%s no dynobj",fn);

  /* Section does not exist - create it.
     The offset field is used for the next table entry offset. */
  sec = add_section(gv->dynobj,(char *)secname[type],NULL,initial_size,
                    sectype,secflags,secprot,2,TRUE);
  sec->offset = initial_offset;
  *secp = sec;

  /* create _GLOBAL_OFFSET_TABLE_ or _PROCEDURE_LINKAGE_TABLE_ linker symbol */
  if (symidx >= 0) {
    if (!findlnksymbol(gv,elf_symnames[symidx]))
      elf_makelnksym(gv,symidx);
  }

  return sec;
}